

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall ast::Div::toString_abi_cxx11_(string *__return_storage_ptr__,Div *this)

{
  ostringstream msg;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"(");
  operator<<((ostream *)local_190,(this->super_BinaryOp).LeftOp);
  std::operator<<((ostream *)local_190," / ");
  operator<<((ostream *)local_190,(this->super_BinaryOp).RightOp);
  std::operator<<((ostream *)local_190,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::Div::toString() const
{
    std::ostringstream msg;
    msg << "(";
    msg << LeftOp;
    msg << " / ";
    msg << RightOp;
    msg << ")";
    return msg.str();
}